

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void __thiscall
trun::TestResponseProxy::Fatal(TestResponseProxy *this,int line,char *file,string *message)

{
  Log *this_00;
  string *psVar1;
  uint uVar2;
  char *pcVar3;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *message_local;
  char *file_local;
  TestResponseProxy *pTStack_10;
  int line_local;
  TestResponseProxy *this_local;
  
  this_00 = this->pLogger;
  local_28 = message;
  message_local = (string *)file;
  file_local._4_4_ = line;
  pTStack_10 = this;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (message);
  gnilk::Log::Debug<char_const*,char_const*,int,char_const*>
            (this_00,"%s:%d:\t\'%s\'",file,line,pcVar3);
  uVar2 = file_local._4_4_;
  psVar1 = message_local;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (message);
  printf("*** FATAL ERROR: %s:%d\t\'%s\'\n",psVar1,(ulong)uVar2,pcVar3);
  uVar2 = file_local._4_4_;
  psVar1 = message_local;
  this->errorCount = this->errorCount + 1;
  if (this->testResult < kTestResult_ModuleFail) {
    this->testResult = kTestResult_ModuleFail;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)psVar1,&local_49);
  std::__cxx11::string::string((string *)&local_80,message);
  trun::AssertError::Add(&this->assertError,kAssert_Fatal,uVar2,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  TerminateThreadIfNeeded(this);
  return;
}

Assistant:

void TestResponseProxy::Fatal(int line, const char *file, std::string message) {
    pLogger->Debug("%s:%d:\t'%s'", file, line, message.c_str());

    printf("*** FATAL ERROR: %s:%d\t'%s'\n", file, line, message.c_str());
    this->errorCount++;
    if (testResult < kTestResult_ModuleFail) {
        testResult = kTestResult_ModuleFail;
    }
    assertError.Add(AssertError::kAssert_Fatal, line, file, message);
    TerminateThreadIfNeeded();
}